

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

void __thiscall
EOPlus::Parser::Parser<std::_Deque_iterator<EOPlus::Token,EOPlus::Token&,EOPlus::Token*>>
          (Parser *this,Quest *quest,
          _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> *begin,
          _Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*> *end)

{
  _Elt_pointer pTVar1;
  _Elt_pointer pTVar2;
  _Elt_pointer pTVar3;
  _Elt_pointer pTVar4;
  _Elt_pointer pTVar5;
  _Elt_pointer pTVar6;
  _Elt_pointer pTVar7;
  _Elt_pointer pTVar8;
  Parser_Token_Server_Base *this_00;
  
  this->quest = quest;
  this_00 = (Parser_Token_Server_Base *)operator_new(0xf8);
  pTVar1 = begin->_M_cur;
  pTVar2 = begin->_M_first;
  pTVar3 = begin->_M_last;
  pTVar4 = (_Elt_pointer)begin->_M_node;
  pTVar5 = end->_M_cur;
  pTVar6 = end->_M_first;
  pTVar7 = end->_M_last;
  pTVar8 = (_Elt_pointer)end->_M_node;
  Parser_Token_Server_Base::Parser_Token_Server_Base(this_00);
  this_00->_vptr_Parser_Token_Server_Base = (_func_int **)&PTR_xGetToken_00201ce8;
  this_00[1]._vptr_Parser_Token_Server_Base = (_func_int **)pTVar1;
  this_00[1].token_buffer.c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)pTVar2;
  *(_Elt_pointer *)((long)&this_00[1].token_buffer.c + 8) = pTVar3;
  ((iterator *)((long)&this_00[1].token_buffer.c + 0x10))->_M_cur = pTVar4;
  *(_Elt_pointer *)((long)&this_00[1].token_buffer.c + 0x18) = pTVar5;
  *(_Elt_pointer *)((long)&this_00[1].token_buffer.c + 0x20) = pTVar6;
  *(_Elt_pointer *)((long)&this_00[1].token_buffer.c + 0x28) = pTVar7;
  ((iterator *)((long)&this_00[1].token_buffer.c + 0x30))->_M_cur = pTVar8;
  (this->tok)._M_t.
  super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
  ._M_t.
  super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
  .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl = this_00;
  return;
}

Assistant:

Parser(Quest& quest, IT begin, IT end)
				: quest(quest)
				, tok(new Parser_Token_Server<IT>(begin, end))
			{ }